

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_TEXKILL(Context *ctx)

{
  char local_58 [8];
  char dst [64];
  Context *ctx_local;
  
  get_ARB1_destarg_varname(ctx,local_58,0x40);
  output_line(ctx,"KIL %s.xyzx;",local_58);
  return;
}

Assistant:

static void emit_ARB1_TEXKILL(Context *ctx)
{
    // d3d kills on xyz, arb1 kills on xyzw. Fix the swizzle.
    //  We just map the x component to w. If it's negative, the fragment
    //  would discard anyhow, otherwise, it'll pass through okay. This saves
    //  us a temp register.
    char dst[64];
    get_ARB1_destarg_varname(ctx, dst, sizeof (dst));
    output_line(ctx, "KIL %s.xyzx;", dst);
}